

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O0

bool ZXing::OneD::AddOn(PartialResult *res,PatternView begin,int digitCount)

{
  bool bVar1;
  Iterator puVar2;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int CHECK_DIGIT_ENCODINGS [10];
  int i;
  int lgPattern;
  double moduleSize;
  PatternView ext;
  size_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  PatternView *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  PatternView *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  FixedPattern<3,_4,_false> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  PatternView local_38;
  int local_14;
  long local_10;
  bool local_1;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  PatternView::subView
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  bVar1 = PatternView::isValid
                    ((PatternView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (bVar1) {
    dVar3 = IsPattern<false,3,4>
                      ((PatternView *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                       (double)in_stack_ffffffffffffff80,
                       (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      bVar1 = PatternView::isAtLastBar(&local_38);
      if ((bVar1) || (puVar2 = PatternView::end(&local_38), dVar3 * 3.0 + -1.0 < (double)*puVar2)) {
        *(Iterator *)(local_10 + 0x20) = local_38._data;
        *(undefined8 *)(local_10 + 0x28) = local_38._8_8_;
        *(Iterator *)(local_10 + 0x30) = local_38._base;
        *(Iterator *)(local_10 + 0x38) = local_38._end;
        FixedPattern<3,_4,_false>::size((FixedPattern<3,_4,_false> *)&EXT_START_PATTERN);
        PatternView::subView
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        iVar5 = 0;
        std::__cxx11::string::clear();
        for (iVar4 = 0; iVar4 < local_14; iVar4 = iVar4 + 1) {
          bVar1 = DecodeDigit(in_stack_ffffffffffffff68,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (int *)in_stack_ffffffffffffff58);
          if (!bVar1) {
            bVar1 = _ret_false_debug_helper();
            return bVar1;
          }
          PatternView::skipSymbol((PatternView *)0x2a0919);
          if (iVar4 < local_14 + -1) {
            dVar3 = IsPattern<false,2,2>
                              ((PatternView *)CONCAT44(iVar5,iVar4),
                               (FixedPattern<2,_2,_false> *)in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff8c,(double)in_stack_ffffffffffffff80,
                               (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                              );
            if ((dVar3 == 0.0) && (!NAN(dVar3))) {
              bVar1 = _ret_false_debug_helper();
              return bVar1;
            }
            PatternView::skipPair((PatternView *)0x2a096f);
          }
        }
        if (local_14 == 2) {
          iVar4 = std::__cxx11::stoi((string *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                     in_stack_ffffffffffffff58,0);
          if (iVar4 % 4 != iVar5) {
            bVar1 = _ret_false_debug_helper();
            return bVar1;
          }
        }
        else {
          memcpy(&stack0xffffffffffffff68,&DAT_003103d0,0x28);
          iVar4 = Ean5Checksum((string *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          iVar5 = IndexOf<int[10],int>
                            ((int (*) [10])in_stack_ffffffffffffff80,
                             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (iVar4 != iVar5) {
            bVar1 = _ret_false_debug_helper();
            return bVar1;
          }
        }
        *(undefined4 *)(local_10 + 0x40) = 0x7ffff;
        local_1 = true;
      }
      else {
        local_1 = _ret_false_debug_helper();
      }
    }
    else {
      local_1 = _ret_false_debug_helper();
    }
  }
  else {
    local_1 = _ret_false_debug_helper();
  }
  return local_1;
}

Assistant:

static bool AddOn(PartialResult& res, PatternView begin, int digitCount)
{
	auto ext = begin.subView(0, 3 + digitCount * 4 + (digitCount - 1) * 2);
	CHECK(ext.isValid());
	auto moduleSize = IsPattern(ext, EXT_START_PATTERN);
	CHECK(moduleSize);

	CHECK(ext.isAtLastBar() || *ext.end() > QUIET_ZONE_ADDON * moduleSize - 1);

	res.end = ext;
	ext = ext.subView(EXT_START_PATTERN.size(), CHAR_LEN);
	int lgPattern = 0;
	res.txt.clear();

	for (int i = 0; i < digitCount; ++i) {
		CHECK(DecodeDigit(ext, res.txt, &lgPattern));
		ext.skipSymbol();
		if (i < digitCount - 1) {
			CHECK(IsPattern(ext, EXT_SEPARATOR_PATTERN, 0, 0, moduleSize));
			ext.skipPair();
		}
	}

	if (digitCount == 2) {
		CHECK(std::stoi(res.txt) % 4 == lgPattern);
	} else {
		constexpr int CHECK_DIGIT_ENCODINGS[] = {0x18, 0x14, 0x12, 0x11, 0x0C, 0x06, 0x03, 0x0A, 0x09, 0x05};
		CHECK(Ean5Checksum(res.txt) == IndexOf(CHECK_DIGIT_ENCODINGS, lgPattern));
	}
	res.format = BarcodeFormat::Any; // make sure res.format is valid, see below
	return true;
}